

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setStateDesiredTrajectory
          (L2NormCost *this,
          shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
          *stateDesiredTrajectory)

{
  bool bVar1;
  __shared_ptr *in_RSI;
  long in_RDI;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
  *in_stack_ffffffffffffff98;
  CostAttributes *this_00;
  bool local_1;
  
  bVar1 = CostAttributes::isValid(*(CostAttributes **)(in_RDI + 0x28));
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
    if (bVar1) {
      this_00 = *(CostAttributes **)(in_RDI + 0x28);
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
      shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                  *)this_00,in_stack_ffffffffffffff98);
      local_1 = CostAttributes::setDesiredTrajectory(this_00,in_stack_ffffffffffffff98);
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
      ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                   *)0x34bff8);
    }
    else {
      iDynTree::reportError
                ("L2NormCost","setStateDesiredTrajectory","Empty desired trajectory pointer.");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("L2NormCost","setStateDesiredTrajectory",
               "The state cost portion has been deactivated, given the provided selectors.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool L2NormCost::setStateDesiredTrajectory(std::shared_ptr<TimeVaryingVector> stateDesiredTrajectory)
        {
            if (!(m_pimpl->stateCost.isValid())) {
                reportError("L2NormCost", "setStateDesiredTrajectory", "The state cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!stateDesiredTrajectory) {
                reportError("L2NormCost", "setStateDesiredTrajectory", "Empty desired trajectory pointer.");
                return false;
            }

            return m_pimpl->stateCost.setDesiredTrajectory(stateDesiredTrajectory);
        }